

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O3

void __thiscall QScrollBar::mousePressEvent(QScrollBar *this,QMouseEvent *e)

{
  QBasicTimer *pQVar1;
  undefined8 uVar2;
  uint uVar3;
  QScrollBarPrivate *this_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  SubControl SVar7;
  int iVar8;
  Representation RVar9;
  QStyle *pQVar10;
  long lVar12;
  int iVar13;
  int iVar14;
  undefined8 *puVar15;
  int iVar16;
  QStyleOptionSlider *pQVar17;
  int iVar18;
  long in_FS_OFFSET;
  byte bVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  QStyleOptionSlider opt;
  int local_e0;
  QRect local_d8;
  QPointF local_c8;
  QStyleOptionSlider local_b8;
  long local_38;
  QPoint QVar11;
  
  bVar19 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QScrollBarPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  if ((this_00->super_QAbstractSliderPrivate).repeatActionTimer.m_id != Invalid) {
    QScrollBarPrivate::stopRepeatAction(this_00);
  }
  pQVar10 = QWidget::style((QWidget *)this);
  iVar6 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,2,0,this,0);
  puVar15 = &DAT_006dcab0;
  pQVar17 = &local_b8;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    uVar2 = *puVar15;
    (pQVar17->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar2;
    (pQVar17->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar2 >> 0x20);
    puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
    pQVar17 = (QStyleOptionSlider *)((long)pQVar17 + (ulong)bVar19 * -0x10 + 8);
  }
  QStyleOptionSlider::QStyleOptionSlider(&local_b8);
  (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x1a8))(this,&local_b8);
  local_b8.keyboardModifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       *(QFlagsStorageHelper<Qt::KeyboardModifier,_4> *)(e + 0x20);
  if (((this_00->super_QAbstractSliderPrivate).maximum !=
       *(int *)&(this_00->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254) &&
     (uVar3 = *(uint *)(e + 0x40), (*(uint *)(e + 0x44) & ~uVar3) == 0)) {
    if (uVar3 == 1 || iVar6 == 0) {
      if (uVar3 == 1) {
LAB_0047401a:
        pQVar10 = QWidget::style((QWidget *)this);
        auVar22 = QEventPoint::position();
        dVar21 = (double)((ulong)auVar22._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar22._0_8_;
        bVar4 = 2147483647.0 < dVar21;
        if (dVar21 <= -2147483648.0) {
          dVar21 = -2147483648.0;
        }
        dVar20 = (double)((ulong)auVar22._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar22._8_8_;
        bVar5 = 2147483647.0 < dVar20;
        if (dVar20 <= -2147483648.0) {
          dVar20 = -2147483648.0;
        }
        local_c8.xp = (qreal)CONCAT44((int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                                   ~-(ulong)bVar5 & (ulong)dVar20),
                                      (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                                   ~-(ulong)bVar4 & (ulong)dVar21));
        SVar7 = (**(code **)(*(long *)pQVar10 + 0xd0))(pQVar10,2,&local_b8,&local_c8,this);
        this_00->pressedControl = SVar7;
        this_00->pointerOutsidePressedControl = false;
        pQVar10 = QWidget::style((QWidget *)this);
        auVar22 = (**(code **)(*(long *)pQVar10 + 0xd8))(pQVar10,2,&local_b8,0x40,this);
        auVar23 = QEventPoint::position();
        dVar21 = (double)((ulong)auVar23._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar23._0_8_;
        bVar4 = 2147483647.0 < dVar21;
        if (dVar21 <= -2147483648.0) {
          dVar21 = -2147483648.0;
        }
        iVar16 = (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar21);
        dVar21 = (double)((ulong)auVar23._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar23._8_8_;
        bVar4 = 2147483647.0 < dVar21;
        if (dVar21 <= -2147483648.0) {
          dVar21 = -2147483648.0;
        }
        iVar18 = (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar21);
        iVar13 = auVar22._4_4_;
        local_e0 = auVar22._0_4_;
        iVar8 = iVar18;
        iVar14 = iVar13;
        auVar23 = auVar22;
        if ((this_00->super_QAbstractSliderPrivate).orientation == Horizontal) {
          auVar23._8_8_ = auVar22._8_8_ << 0x20;
          auVar23._0_8_ = auVar22._0_8_ << 0x20;
          iVar8 = iVar16;
          iVar14 = local_e0;
        }
        lVar12 = (auVar23._0_8_ >> 0x20) + (auVar23._8_8_ >> 0x20);
        iVar8 = QScrollBarPrivate::pixelPosToRangeValue
                          (this_00,(iVar14 - (int)((ulong)(lVar12 - (lVar12 >> 0x3f)) >> 1)) + iVar8
                          );
        (this_00->super_QAbstractSliderPrivate).pressValue = iVar8;
        SVar7 = this_00->pressedControl;
        if ((SVar7 == SC_ComboBoxArrow) || (SVar7 == SC_ComboBoxListBoxPopup)) {
          if ((iVar6 == 0) || (*(int *)(e + 0x40) != 4)) {
            pQVar10 = QWidget::style((QWidget *)this);
            iVar6 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x27,&local_b8,this,0);
            if ((iVar6 == 0) || (*(int *)(e + 0x40) != 1)) goto LAB_0047433f;
          }
          iVar6 = *(int *)(*(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8 + 0x280);
          local_c8 = (QPointF)QEventPoint::position();
          if (iVar6 == 1) {
            local_e0 = auVar22._8_4_ - local_e0;
            QVar11 = QPointF::toPoint(&local_c8);
            RVar9 = QVar11.xp.m_i;
          }
          else {
            local_e0 = auVar22._12_4_ - iVar13;
            QVar11 = QPointF::toPoint(&local_c8);
            RVar9 = QVar11.yp.m_i;
          }
          iVar16 = (local_e0 + 1) / 2;
          iVar6 = QScrollBarPrivate::pixelPosToRangeValue(this_00,RVar9.m_i - iVar16);
          QAbstractSlider::setSliderPosition(&this->super_QAbstractSlider,iVar6);
          this_00->pressedControl = SC_ScrollBarSlider;
          this_00->clickOffset = iVar16;
        }
        else if (SVar7 == SC_ScrollBarSlider) {
          iVar6 = iVar18 - iVar13;
          if (*(int *)(*(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8 + 0x280) == 1
             ) {
            iVar6 = iVar16 - local_e0;
          }
          this_00->clickOffset = iVar6;
          this_00->snapBackPosition = (this_00->super_QAbstractSliderPrivate).position;
        }
LAB_0047433f:
        local_c8.xp = -0.0;
        local_c8.yp = -0.0;
        QElapsedTimer::start();
        QScrollBarPrivate::activateControl(this_00,this_00->pressedControl,500);
        pQVar10 = QWidget::style((QWidget *)this);
        local_d8 = (QRect)(**(code **)(*(long *)pQVar10 + 0xd8))
                                    (pQVar10,2,&local_b8,this_00->pressedControl,this);
        QWidget::repaint((QWidget *)this,&local_d8);
        lVar12 = QElapsedTimer::elapsed();
        if ((499 < lVar12) &&
           (pQVar1 = &(this_00->super_QAbstractSliderPrivate).repeatActionTimer,
           pQVar1->m_id != Invalid)) {
          QBasicTimer::start(pQVar1,50000000,1,this);
        }
        if (this_00->pressedControl == SC_ScrollBarSlider) {
          QAbstractSlider::setSliderDown(&this->super_QAbstractSlider,true);
        }
        goto LAB_00473fcc;
      }
    }
    else if (uVar3 == 4) goto LAB_0047401a;
  }
  e[0xc] = (QMouseEvent)0x0;
LAB_00473fcc:
  QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollBar::mousePressEvent(QMouseEvent *e)
{
    Q_D(QScrollBar);

    if (d->repeatActionTimer.isActive())
        d->stopRepeatAction();

    bool midButtonAbsPos = style()->styleHint(QStyle::SH_ScrollBar_MiddleClickAbsolutePosition,
                                             nullptr, this);
    QStyleOptionSlider opt;
    initStyleOption(&opt);
    opt.keyboardModifiers = e->modifiers();

    if (d->maximum == d->minimum // no range
        || (e->buttons() & (~e->button())) // another button was clicked before
        || !(e->button() == Qt::LeftButton || (midButtonAbsPos && e->button() == Qt::MiddleButton))) {
        e->ignore();
        return;
    }

    d->pressedControl = style()->hitTestComplexControl(QStyle::CC_ScrollBar, &opt, e->position().toPoint(), this);
    d->pointerOutsidePressedControl = false;

    QRect sr = style()->subControlRect(QStyle::CC_ScrollBar, &opt,
                                       QStyle::SC_ScrollBarSlider, this);
    QPoint click = e->position().toPoint();
    QPoint pressValue = click - sr.center() + sr.topLeft();
    d->pressValue = d->orientation == Qt::Horizontal ? d->pixelPosToRangeValue(pressValue.x()) :
        d->pixelPosToRangeValue(pressValue.y());
    if (d->pressedControl == QStyle::SC_ScrollBarSlider) {
        d->clickOffset = HORIZONTAL ? (click.x()-sr.x()) : (click.y()-sr.y());
        d->snapBackPosition = d->position;
    }

    if ((d->pressedControl == QStyle::SC_ScrollBarAddPage
          || d->pressedControl == QStyle::SC_ScrollBarSubPage)
        && ((midButtonAbsPos && e->button() == Qt::MiddleButton)
            || (style()->styleHint(QStyle::SH_ScrollBar_LeftClickAbsolutePosition, &opt, this)
                && e->button() == Qt::LeftButton))) {
        int sliderLength = HORIZONTAL ? sr.width() : sr.height();
        setSliderPosition(d->pixelPosToRangeValue((HORIZONTAL ? e->position().toPoint().x()
                                                              : e->position().toPoint().y()) - sliderLength / 2));
        d->pressedControl = QStyle::SC_ScrollBarSlider;
        d->clickOffset = sliderLength / 2;
    }
    const int initialDelay = 500; // default threshold
    QElapsedTimer time;
    time.start();
    d->activateControl(d->pressedControl, initialDelay);
    repaint(style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this));
    if (time.elapsed() >= initialDelay && d->repeatActionTimer.isActive()) {
        // It took more than 500ms (the initial timer delay) to process
        // the control activation and repaint(), we therefore need
        // to restart the timer in case we have a pending mouse release event;
        // otherwise we'll get a timer event right before the release event,
        // causing the repeat action to be invoked twice on a single mouse click.
        // 50ms is the default repeat time (see activateControl/setRepeatAction).
        d->repeatActionTimer.start(50, this);
    }
    if (d->pressedControl == QStyle::SC_ScrollBarSlider)
        setSliderDown(true);
}